

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void * radio_donew(t_symbol *s,int argc,t_atom *argv,int old)

{
  t_iem_fstyle_flags tVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  t_iemgui *iemgui;
  _glist *p_Var5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  t_float tVar12;
  t_float tVar13;
  t_float tVar14;
  float fVar15;
  undefined8 local_78;
  t_iemgui_drawfunctions local_68;
  
  iemgui = iemgui_new(radio_class);
  p_Var5 = canvas_getcurrent();
  iVar2 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  p_Var5 = canvas_getcurrent();
  iVar3 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  if (*s->s_name == 'v') {
    *(undefined4 *)&iemgui[1].x_obj.te_outlet = 1;
  }
  iVar11 = iemgui->x_fontsize;
  *(int *)((long)&iemgui[1].x_obj.te_outlet + 4) = old;
  local_68.draw_new = radio_draw_new;
  local_68.draw_config = radio_draw_config;
  local_68.draw_iolets = radio_draw_io;
  local_68.draw_update = radio_draw_update;
  local_68.draw_select = radio_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_68);
  if (((((argc == 0xf) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
      (((argv[2].a_type == A_FLOAT && (argv[3].a_type == A_FLOAT)) &&
       ((argv[4].a_type - A_FLOAT < 2 &&
        ((argv[5].a_type - A_FLOAT < 2 && (argv[6].a_type - A_FLOAT < 2)))))))) &&
     ((argv[7].a_type == A_FLOAT &&
      ((((argv[8].a_type == A_FLOAT && (argv[9].a_type == A_FLOAT)) && (argv[10].a_type == A_FLOAT))
       && (argv[0xe].a_type == A_FLOAT)))))) {
    tVar12 = atom_getfloatarg(0,0xf,argv);
    iVar2 = (int)tVar12;
    tVar12 = atom_getfloatarg(1,0xf,argv);
    tVar13 = atom_getfloatarg(2,0xf,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar13);
    tVar13 = atom_getfloatarg(3,0xf,argv);
    iVar3 = (int)tVar13;
    iemgui_new_getnames(iemgui,4,argv);
    tVar13 = atom_getfloatarg(7,0xf,argv);
    tVar14 = atom_getfloatarg(8,0xf,argv);
    local_78 = CONCAT44((int)tVar14,(int)tVar13);
    tVar13 = atom_getfloatarg(9,0xf,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar13);
    tVar13 = atom_getfloatarg(10,0xf,argv);
    iVar11 = (int)tVar13;
    iemgui_all_loadcolors(iemgui,argv + 0xb,argv + 0xc,argv + 0xd);
    fVar15 = atom_getfloatarg(0xe,0xf,argv);
    uVar10 = (uint)((int)tVar12 != 0);
  }
  else {
    iVar2 = iVar2 + 5;
    iemgui_new_getnames(iemgui,4,(t_atom *)0x0);
    local_78 = (ulong)(uint)(int)((double)(iVar3 * -8 + -0x28) / 15.0) << 0x20;
    fVar15 = 0.0;
    iVar3 = 8;
    uVar10 = 1;
  }
  tVar1 = iemgui->x_fsf;
  uVar6 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  uVar7 = (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6;
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar7 | (uint)tVar1 & 0xffffff3f | uVar6);
  if (((uint)tVar1 & 0x3f) == 2) {
    builtin_strncpy(iemgui->x_font,"times",6);
  }
  else if (((uint)tVar1 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar7 | (uint)tVar1 & 0xffffff00 | uVar6);
    strcpy(iemgui->x_font,sys_font);
  }
  iVar4 = 1;
  if (1 < iVar3) {
    iVar4 = iVar3;
  }
  if (0x7f < iVar4) {
    iVar4 = 0x80;
  }
  *(int *)((long)&iemgui[1].x_obj.te_g.g_next + 4) = iVar4;
  *(float *)((long)&iemgui[1].x_obj.te_binbuf + 4) = fVar15;
  iVar3 = 0;
  if (((uint)iemgui->x_isa & 1) != 0) {
    iVar8 = (int)fVar15;
    iVar9 = 0;
    if (0 < iVar8) {
      iVar9 = iVar8;
    }
    iVar3 = iVar4 + -1;
    if (iVar8 < iVar4) {
      iVar3 = iVar9;
    }
  }
  *(int *)&iemgui[1].x_obj.te_g.g_pd = iVar3;
  *(int *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) = iVar3;
  *(uint *)&iemgui[1].x_obj.te_g.g_next = uVar10;
  if (((uint)iemgui->x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = (int)local_78;
  iemgui->x_ldy = (int)((ulong)local_78 >> 0x20);
  iVar3 = 4;
  if (4 < iVar11) {
    iVar3 = iVar11;
  }
  iemgui->x_fontsize = iVar3;
  iVar2 = iemgui_clip_size(iVar2);
  iemgui->x_w = iVar2;
  iemgui->x_h = iVar2;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_list);
  return iemgui;
}

Assistant:

static void *radio_donew(t_symbol *s, int argc, t_atom *argv, int old)
{
    t_radio *x = (t_radio *)iemgui_new(radio_class);
    int a = IEM_GUI_DEFAULTSIZE, on = 0;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE, chg = 1, num = 8;
    int fs = x->x_gui.x_fontsize;
    t_float fval = 0;
    if('v' == *s->s_name)
        x->x_orientation = vertical;
    x->x_compat = old;

    IEMGUI_SETDRAWFUNCTIONS(x, radio);

    if((argc == 15)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2)
       &&IS_A_FLOAT(argv,3)
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&(IS_A_SYMBOL(argv,5)||IS_A_FLOAT(argv,5))
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)&&IS_A_FLOAT(argv,14))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        chg = (int)atom_getfloatarg(1, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(2, argc, argv));
        num = (int)atom_getfloatarg(3, argc, argv);
        iemgui_new_getnames(&x->x_gui, 4, argv);
        ldx = (int)atom_getfloatarg(7, argc, argv);
        ldy = (int)atom_getfloatarg(8, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(9, argc, argv));
        fs = (int)atom_getfloatarg(10, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+11, argv+12, argv+13);
        fval = atom_getfloatarg(14, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 4, 0);
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(num < 1)
        num = 1;
    if(num > IEM_RADIO_MAX)
        num = IEM_RADIO_MAX;
    x->x_number = num;
    x->x_fval = fval;
    on = fval;
    if(on < 0)
        on = 0;
    if(on >= x->x_number)
        on = x->x_number - 1;
    if(x->x_gui.x_isa.x_loadinit)
        x->x_on = on;
    else
        x->x_on = 0;
    x->x_on_old = x->x_on;
    x->x_change = (chg == 0) ? 0 : 1;
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_list);
    return (x);
}